

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.cpp
# Opt level: O1

void __thiscall blc::math::Float::align(Float *this)

{
  int iVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = this->_nb;
  dVar3 = ABS(dVar2);
  if (dVar3 <= 1.0) {
    if (1.0 <= dVar3) {
      return;
    }
    iVar1 = this->_E;
    do {
      iVar1 = iVar1 + -1;
      dVar2 = dVar2 * 10.0;
    } while (ABS(dVar2) < 1.0);
  }
  else {
    if (dVar3 < 10.0) {
      return;
    }
    iVar1 = this->_E;
    do {
      iVar1 = iVar1 + 1;
      dVar2 = dVar2 / 10.0;
    } while (10.0 <= ABS(dVar2));
  }
  this->_E = iVar1;
  this->_nb = dVar2;
  return;
}

Assistant:

void blc::math::Float::align() {
	if (this->_nb > 1 || this->_nb < -1) {
		for (; this->_nb >= 10 || this->_nb <= -10;) {
			this->_E++;
			this->_nb /= 10;
		}
	} else {
		for (; this->_nb < 1 && this->_nb > -1;) {
			this->_E--;
			this->_nb *= 10;
		}
	}
}